

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

reference<mpt::layout::text> * __thiscall
mpt::reference<mpt::layout::text>::operator=
          (reference<mpt::layout::text> *this,reference<mpt::layout::text> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  text *ptVar2;
  
  ptVar2 = ref->_ref;
  if (ptVar2 != this->_ref) {
    if (ptVar2 == (text *)0x0) {
      ptVar2 = (text *)0x0;
    }
    else {
      iVar1 = (*(ptVar2->super_metatype).super_convertable._vptr_convertable[2])(ptVar2);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        ptVar2 = (text *)0x0;
      }
    }
    if (this->_ref != (text *)0x0) {
      (*(this->_ref->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = ptVar2;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}